

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O3

int run_test_tcp_create_early(void)

{
  ushort uVar1;
  int iVar2;
  undefined8 uVar3;
  ushort *puVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  undefined8 unaff_RBX;
  char *pcVar8;
  bool bVar9;
  int namelen;
  uv_os_fd_t fd;
  sockaddr_in sockname;
  sockaddr_in addr;
  uv_tcp_t client;
  undefined1 auStack_5e0 [16];
  undefined1 auStack_5d0 [248];
  char acStack_4d8 [248];
  char acStack_3e0 [96];
  code *pcStack_380;
  undefined1 auStack_370 [248];
  code *pcStack_278;
  int aiStack_264 [2];
  int aiStack_25c [7];
  undefined1 auStack_240 [16];
  long alStack_230 [31];
  undefined8 uStack_138;
  int local_124;
  short local_120 [2];
  int local_11c;
  undefined1 local_110 [4];
  int local_10c;
  undefined1 local_100 [248];
  
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,local_110);
  if (iVar2 == 0) {
    uVar3 = uv_default_loop();
    iVar2 = uv_tcp_init_ex(uVar3,local_100,2);
    if (iVar2 != 0) goto LAB_00172749;
    iVar2 = uv_fileno(local_100,&local_124);
    if (iVar2 != 0) goto LAB_0017274e;
    if (local_124 == -1) goto LAB_00172753;
    iVar2 = uv_tcp_getsockname(local_100,local_120);
    if (iVar2 != 0) goto LAB_00172758;
    if (local_120[0] != 2) goto LAB_0017275d;
    iVar2 = uv_tcp_bind(local_100,local_110,0);
    if (iVar2 != 0) goto LAB_00172762;
    iVar2 = uv_tcp_getsockname(local_100,local_120);
    if (iVar2 != 0) goto LAB_00172767;
    if (local_10c != local_11c) goto LAB_0017276c;
    uv_close(local_100,0);
    uVar3 = uv_default_loop();
    uv_run(uVar3,0);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar3 = uv_default_loop();
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_create_early_cold_1();
LAB_00172749:
    run_test_tcp_create_early_cold_2();
LAB_0017274e:
    run_test_tcp_create_early_cold_3();
LAB_00172753:
    run_test_tcp_create_early_cold_10();
LAB_00172758:
    run_test_tcp_create_early_cold_4();
LAB_0017275d:
    run_test_tcp_create_early_cold_5();
LAB_00172762:
    run_test_tcp_create_early_cold_6();
LAB_00172767:
    run_test_tcp_create_early_cold_7();
LAB_0017276c:
    run_test_tcp_create_early_cold_8();
  }
  run_test_tcp_create_early_cold_9();
  pcStack_278 = (code *)0x17278f;
  uStack_138 = unaff_RBX;
  iVar2 = uv_interface_addresses(alStack_230,aiStack_25c);
  if (iVar2 != 0) {
LAB_001728e5:
    pcStack_278 = (code *)0x1728ea;
    run_test_tcp_create_early_bad_bind_cold_1();
    return 1;
  }
  if ((long)aiStack_25c[0] < 1) {
    pcStack_278 = (code *)0x1728e5;
    uv_free_interface_addresses();
    goto LAB_001728e5;
  }
  puVar4 = (ushort *)(alStack_230[0] + 0x14);
  uVar7 = 1;
  do {
    uVar1 = *puVar4;
    uVar5 = (ulong)uVar1;
    if (uVar1 == 10) break;
    puVar4 = puVar4 + 0x28;
    bVar9 = uVar7 < (ulong)(long)aiStack_25c[0];
    uVar7 = uVar7 + 1;
  } while (bVar9);
  pcStack_278 = (code *)0x1727d1;
  uv_free_interface_addresses();
  if (uVar1 != 10) goto LAB_001728e5;
  pcStack_278 = (code *)0x1727f1;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_240);
  if (iVar2 == 0) {
    pcStack_278 = (code *)0x1727fe;
    uVar3 = uv_default_loop();
    pcStack_278 = (code *)0x172810;
    iVar2 = uv_tcp_init_ex(uVar3,alStack_230,10);
    if (iVar2 != 0) goto LAB_001728f6;
    pcStack_278 = (code *)0x172827;
    iVar2 = uv_fileno(alStack_230,aiStack_264);
    if (iVar2 != 0) goto LAB_001728fb;
    if (aiStack_264[0] == -1) goto LAB_00172900;
    aiStack_264[1] = 0x1c;
    pcStack_278 = (code *)0x172854;
    iVar2 = uv_tcp_getsockname(alStack_230,aiStack_25c);
    if (iVar2 != 0) goto LAB_00172905;
    if ((short)aiStack_25c[0] != 10) goto LAB_0017290a;
    uVar5 = 0;
    pcStack_278 = (code *)0x17287b;
    iVar2 = uv_tcp_bind(alStack_230,auStack_240,0);
    if (iVar2 != -0x16) goto LAB_0017290f;
    pcStack_278 = (code *)0x172890;
    uv_close(alStack_230,0);
    pcStack_278 = (code *)0x172895;
    uVar3 = uv_default_loop();
    pcStack_278 = (code *)0x17289f;
    uv_run(uVar3,0);
    pcStack_278 = (code *)0x1728a4;
    uVar3 = uv_default_loop();
    pcStack_278 = (code *)0x1728b8;
    uv_walk(uVar3,close_walk_cb,0);
    pcStack_278 = (code *)0x1728c2;
    uv_run(uVar3,0);
    pcStack_278 = (code *)0x1728c7;
    uVar3 = uv_default_loop();
    pcStack_278 = (code *)0x1728cf;
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_278 = (code *)0x1728f6;
    run_test_tcp_create_early_bad_bind_cold_2();
LAB_001728f6:
    pcStack_278 = (code *)0x1728fb;
    run_test_tcp_create_early_bad_bind_cold_3();
LAB_001728fb:
    pcStack_278 = (code *)0x172900;
    run_test_tcp_create_early_bad_bind_cold_4();
LAB_00172900:
    pcStack_278 = (code *)0x172905;
    run_test_tcp_create_early_bad_bind_cold_9();
LAB_00172905:
    pcStack_278 = (code *)0x17290a;
    run_test_tcp_create_early_bad_bind_cold_5();
LAB_0017290a:
    pcStack_278 = (code *)0x17290f;
    run_test_tcp_create_early_bad_bind_cold_6();
LAB_0017290f:
    pcStack_278 = (code *)0x172914;
    run_test_tcp_create_early_bad_bind_cold_7();
  }
  pcStack_278 = run_test_tcp_create_early_bad_domain;
  run_test_tcp_create_early_bad_bind_cold_8();
  pcStack_380 = (code *)0x172926;
  pcStack_278 = (code *)uVar5;
  uVar3 = uv_default_loop();
  pcStack_380 = (code *)0x172938;
  iVar2 = uv_tcp_init_ex(uVar3,auStack_370,0x2f);
  if (iVar2 == -0x16) {
    pcStack_380 = (code *)0x172942;
    uVar3 = uv_default_loop();
    pcStack_380 = (code *)0x172954;
    iVar2 = uv_tcp_init_ex(uVar3,auStack_370,0x400);
    if (iVar2 != -0x16) goto LAB_001729ac;
    pcStack_380 = (code *)0x17295e;
    uVar3 = uv_default_loop();
    pcStack_380 = (code *)0x172968;
    uv_run(uVar3,0);
    pcStack_380 = (code *)0x17296d;
    uVar5 = uv_default_loop();
    pcStack_380 = (code *)0x172981;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_380 = (code *)0x17298b;
    uv_run(uVar5,0);
    pcStack_380 = (code *)0x172990;
    uVar3 = uv_default_loop();
    pcStack_380 = (code *)0x172998;
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_380 = (code *)0x1729ac;
    run_test_tcp_create_early_bad_domain_cold_1();
LAB_001729ac:
    pcStack_380 = (code *)0x1729b1;
    run_test_tcp_create_early_bad_domain_cold_2();
  }
  pcStack_380 = run_test_tcp_create_early_accept;
  run_test_tcp_create_early_bad_domain_cold_3();
  pcStack_380 = (code *)uVar5;
  pcVar6 = (char *)uv_default_loop();
  pcVar8 = "0.0.0.0";
  iVar2 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_5d0);
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(pcVar6,acStack_4d8);
    pcVar8 = pcVar6;
    if (iVar2 != 0) goto LAB_00172ae5;
    pcVar8 = acStack_4d8;
    iVar2 = uv_tcp_bind(pcVar8,auStack_5d0,0);
    if (iVar2 != 0) goto LAB_00172aea;
    pcVar8 = acStack_4d8;
    iVar2 = uv_listen(pcVar8,0x80,on_connection);
    if (iVar2 != 0) goto LAB_00172aef;
    pcVar6 = (char *)uv_default_loop();
    pcVar8 = "127.0.0.1";
    iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_5e0);
    if (iVar2 != 0) goto LAB_00172af4;
    iVar2 = uv_tcp_init(pcVar6,auStack_5d0);
    if (iVar2 != 0) goto LAB_00172af9;
    pcVar6 = acStack_3e0;
    iVar2 = uv_tcp_connect(pcVar6,auStack_5d0,auStack_5e0,on_connect);
    if (iVar2 == 0) {
      uVar3 = uv_default_loop();
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      pcVar6 = (char *)uv_default_loop();
      iVar2 = uv_loop_close(pcVar6);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00172b03;
    }
  }
  else {
    run_test_tcp_create_early_accept_cold_1();
LAB_00172ae5:
    run_test_tcp_create_early_accept_cold_2();
LAB_00172aea:
    run_test_tcp_create_early_accept_cold_3();
LAB_00172aef:
    run_test_tcp_create_early_accept_cold_4();
LAB_00172af4:
    pcVar6 = pcVar8;
    run_test_tcp_create_early_accept_cold_5();
LAB_00172af9:
    run_test_tcp_create_early_accept_cold_6();
  }
  run_test_tcp_create_early_accept_cold_7();
LAB_00172b03:
  run_test_tcp_create_early_accept_cold_8();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    iVar2 = uv_close(pcVar6,0);
    return iVar2;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_create_early) {
  struct sockaddr_in addr;
  struct sockaddr_in sockname;
  uv_tcp_t client;
  uv_os_fd_t fd;
  int r, namelen;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init_ex(uv_default_loop(), &client, AF_INET);
  ASSERT(r == 0);

  r = uv_fileno((const uv_handle_t*) &client, &fd);
  ASSERT(r == 0);
  ASSERT(fd != INVALID_FD);

  /* Windows returns WSAEINVAL if the socket is not bound */
#ifndef _WIN32
  namelen = sizeof sockname;
  r = uv_tcp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
  ASSERT(r == 0);
  ASSERT(sockname.sin_family == AF_INET);
#endif

  r = uv_tcp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  namelen = sizeof sockname;
  r = uv_tcp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
  ASSERT(r == 0);
  ASSERT(memcmp(&addr.sin_addr,
                &sockname.sin_addr,
                sizeof(addr.sin_addr)) == 0);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}